

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvc.c
# Opt level: O0

int cvcUsage(void)

{
  printf("bee2cmd/%s: %s\nUsage:\n  cvc root [options] <privkeya> <certa>\n    issue self-signed certificate <certa>\n  cvc req [options] <privkey> <req>\n    generate pre-certificate <req>\n  cvc iss [options] <privkeya> <certa> <req> <cert>\n    issue <cert> based on <req> and subordinate to <certa>\n  cvc shorten [options] <privkeya> <certa> <cert>\n    shorten the lifetime of <cert> subordinate to <certa>\n  cvc val [options] <certa> <certb> ... <cert>\n    validate <certb> ... <cert> using <certa> as an anchor\n  cvc match [options] <privkey> <cert>\n    check the match between <privkey> and <cert>\n  cvc extr <cert> <pubkey>\n    extract <pubkey> from <cert>\n  cvc print [field] <cert>\n    print <cert> info: all fields or a specific field\n  .\n  <privkey>, <privkeya>\n    containers with private keys\n  <pubkey>\n    file with public key\n  options:\n    -authority <name> -- authority       [root] req\n    -holder <name> -- holder             [root] req [iss]\n    -from <YYMMDD> -- starting date      root req [iss]\n    -until <YYMMDD> -- expiration date   root req [iss] cut\n    -eid <10*hex> -- eId access mask     [root] [req] [iss]\n    -esign <4*hex> -- eSign access mask  [root] [req] [iss]\n    -pass <schema> -- password           root req iss shorten match\n    -date <YYMMDD> -- validation date    [val]\n  field:\n    {-authority|-holder|-from|-until|-eid|-esign|-pubkey|-sig}\n"
         ,"cvc","manage CV-certificates");
  return -1;
}

Assistant:

static int cvcUsage()
{
	printf(
		"bee2cmd/%s: %s\n"
		"Usage:\n"
		"  cvc root [options] <privkeya> <certa>\n"
		"    issue self-signed certificate <certa>\n"
		"  cvc req [options] <privkey> <req>\n"
		"    generate pre-certificate <req>\n"
		"  cvc iss [options] <privkeya> <certa> <req> <cert>\n"
		"    issue <cert> based on <req> and subordinate to <certa>\n"
		"  cvc shorten [options] <privkeya> <certa> <cert>\n"
		"    shorten the lifetime of <cert> subordinate to <certa>\n"
		"  cvc val [options] <certa> <certb> ... <cert>\n"
		"    validate <certb> ... <cert> using <certa> as an anchor\n"
		"  cvc match [options] <privkey> <cert>\n"
		"    check the match between <privkey> and <cert>\n"
		"  cvc extr <cert> <pubkey>\n"
		"    extract <pubkey> from <cert>\n"
		"  cvc print [field] <cert>\n"
		"    print <cert> info: all fields or a specific field\n"
		"  .\n"
		"  <privkey>, <privkeya>\n"
		"    containers with private keys\n"
		"  <pubkey>\n"
		"    file with public key\n"
		"  options:\n"
		"    -authority <name> -- authority       [root] req\n"
		"    -holder <name> -- holder             [root] req [iss]\n"
		"    -from <YYMMDD> -- starting date      root req [iss]\n"
		"    -until <YYMMDD> -- expiration date   root req [iss] cut\n"
		"    -eid <10*hex> -- eId access mask     [root] [req] [iss]\n"
		"    -esign <4*hex> -- eSign access mask  [root] [req] [iss]\n"
		"    -pass <schema> -- password           root req iss shorten match\n"
		"    -date <YYMMDD> -- validation date    [val]\n"
		"  field:\n"
		"    {-authority|-holder|-from|-until|-eid|-esign|-pubkey|-sig}\n"
		,
		_name, _descr
	);
	return -1;
}